

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall
BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
UpdateBlock(BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this,IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *Node)

{
  bool bVar1;
  int iVar2;
  iterator it;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20d0;
  string local_2060 [32];
  undefined1 local_2040 [8];
  Block B;
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *Node_local;
  BpTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  B._8224_8_ = Node;
  Block::Block((Block *)local_2040,blocks.buffer + (Node->self).BlockNum);
  if (((Node->self).FileOff != B._24_4_) ||
     (bVar1 = std::operator!=(&this->Index_FileName,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_2040), bVar1)) {
    std::__cxx11::string::string(local_2060,(string *)&this->Index_FileName);
    iVar2 = Buffer::Allocate(&blocks,(string *)local_2060,(Node->self).FileOff);
    (Node->self).BlockNum = iVar2;
    std::__cxx11::string::~string(local_2060);
  }
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  IndexNode(&local_20d0,Node);
  Node2Block(this,&local_20d0);
  IndexNode<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~IndexNode(&local_20d0);
  it = Buffer::Find(&blocks,(Node->self).BlockNum);
  Buffer::Update(&blocks,it);
  Block::~Block((Block *)local_2040);
  return;
}

Assistant:

void BpTree<K>::UpdateBlock(IndexNode<K> Node) {
	Block B = blocks.buffer[Node.self.BlockNum];
	if (Node.self.FileOff != B.FileOff || this->Index_FileName != B.FileName) {
		//�����һ���Ѿ�������ռ�죬��Ҫ����µ�һ��
		Node.self.BlockNum = blocks.Allocate(this->Index_FileName, Node.self.FileOff);
	}
	this->Node2Block(Node);
	blocks.Update(blocks.Find(Node.self.BlockNum));
}